

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSVIWriterHandlers.cpp
# Opt level: O0

void __thiscall
PSVIWriterHandlers::handleElementPSVI
          (PSVIWriterHandlers *this,XMLCh *param_1,XMLCh *param_2,PSVIElement *elementInfo)

{
  bool bVar1;
  ASSESSMENT_TYPE validation;
  VALIDITY_STATE validity;
  XSModel *model;
  XMLCh *pXVar2;
  XSTypeDefinition *pXVar3;
  XSElementDeclaration *elemDecl;
  XSNotationDeclaration *obj;
  XMLCh *local_38;
  PSVIElement *elementInfo_local;
  XMLCh *param_2_local;
  XMLCh *param_1_local;
  PSVIWriterHandlers *this_local;
  
  processActualValue(this,(PSVIItem *)elementInfo);
  processChildrenEnd(this);
  model = xercesc_4_0::PSVIElement::getSchemaInformation(elementInfo);
  processSchemaInformation(this,model);
  validation = xercesc_4_0::PSVIItem::getValidationAttempted((PSVIItem *)elementInfo);
  pXVar2 = translateValidationAttempted(this,validation);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValidationAttempted,pXVar2);
  pXVar2 = xercesc_4_0::PSVIItem::getValidationContext((PSVIItem *)elementInfo);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValidationContext,pXVar2);
  validity = xercesc_4_0::PSVIItem::getValidity((PSVIItem *)elementInfo);
  pXVar2 = translateValidity(this,validity);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgValidity,pXVar2);
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaErrorCode);
  pXVar2 = xercesc_4_0::PSVIItem::getSchemaNormalizedValue((PSVIItem *)elementInfo);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaNormalizedValue,pXVar2);
  pXVar2 = xercesc_4_0::PSVIItem::getCanonicalRepresentation((PSVIItem *)elementInfo);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgCanonicalRepresentation,pXVar2);
  bVar1 = xercesc_4_0::PSVIItem::getIsSchemaSpecified((PSVIItem *)elementInfo);
  if (bVar1) {
    local_38 = (XMLCh *)&xercesc_4_0::PSVIUni::fgSchema;
  }
  else {
    local_38 = (XMLCh *)&xercesc_4_0::PSVIUni::fgInfoset;
  }
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaSpecified,local_38);
  pXVar2 = xercesc_4_0::PSVIItem::getSchemaDefault((PSVIItem *)elementInfo);
  sendElementValue(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgSchemaDefault,pXVar2);
  pXVar3 = (XSTypeDefinition *)(**(code **)(*(long *)elementInfo + 0x10))();
  processTypeDefinitionRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgTypeDefinition,pXVar3);
  pXVar3 = (XSTypeDefinition *)(**(code **)(*(long *)elementInfo + 0x18))();
  processTypeDefinitionRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgMemberTypeDefinition,pXVar3);
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNil);
  elemDecl = xercesc_4_0::PSVIElement::getElementDeclaration(elementInfo);
  processElementDeclarationRef(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgDeclaration,elemDecl);
  obj = xercesc_4_0::PSVIElement::getNotationDeclaration(elementInfo);
  sendReference(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgNotation,(XSObject *)obj);
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgIdIdrefTable);
  sendElementEmpty(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgIdentityConstraintTable);
  sendUnindentedElement(this,(XMLCh *)&xercesc_4_0::PSVIUni::fgElement);
  return;
}

Assistant:

void PSVIWriterHandlers::handleElementPSVI(	const XMLCh* const /* localName */,
											const XMLCh* const /* uri */,
											PSVIElement* elementInfo ) {

    processActualValue(elementInfo);
	processChildrenEnd();
	processSchemaInformation(elementInfo->getSchemaInformation());
	sendElementValue( PSVIUni::fgValidationAttempted,
		translateValidationAttempted(elementInfo->getValidationAttempted()));
	sendElementValue(PSVIUni::fgValidationContext, elementInfo->getValidationContext());
	sendElementValue(PSVIUni::fgValidity, translateValidity(elementInfo->getValidity()));
	//REVISIT errorCodes not supported
	//processSchemaErrorCode(elementInfo->getErrorCodes());
	sendElementEmpty(PSVIUni::fgSchemaErrorCode);
	sendElementValue(PSVIUni::fgSchemaNormalizedValue, elementInfo->getSchemaNormalizedValue());
	sendElementValue(PSVIUni::fgCanonicalRepresentation, elementInfo->getCanonicalRepresentation());
	sendElementValue(PSVIUni::fgSchemaSpecified,
		(elementInfo->getIsSchemaSpecified() ? PSVIUni::fgSchema : PSVIUni::fgInfoset));
	sendElementValue(PSVIUni::fgSchemaDefault, elementInfo->getSchemaDefault());
	processTypeDefinitionRef(PSVIUni::fgTypeDefinition, elementInfo->getTypeDefinition());
	processTypeDefinitionRef(PSVIUni::fgMemberTypeDefinition, elementInfo->getMemberTypeDefinition());
	sendElementEmpty(PSVIUni::fgNil);
	processElementDeclarationRef(PSVIUni::fgDeclaration, elementInfo->getElementDeclaration());
	sendReference(PSVIUni::fgNotation, elementInfo->getNotationDeclaration());
	sendElementEmpty(PSVIUni::fgIdIdrefTable);
	sendElementEmpty(PSVIUni::fgIdentityConstraintTable);
	sendUnindentedElement(PSVIUni::fgElement);

}